

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

size_t svb_encode(uint8_t *out,uint32_t *in,uint32_t count,int delta,int type)

{
  uint uVar1;
  uint32_t *in_00;
  uint8_t *puVar2;
  uint in_ECX;
  int in_EDX;
  int *in_RDI;
  uint in_R8D;
  uint8_t *dataPtr;
  uint32_t keyLen;
  uint8_t *keyPtr;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  *in_RDI = in_EDX;
  in_00 = (uint32_t *)(in_RDI + 1);
  uVar1 = in_EDX + 3U >> 2;
  if ((in_ECX == 0) && (in_R8D == 1)) {
    puVar2 = svb_encode_scalar((uint32_t *)CONCAT44(1,in_stack_ffffffffffffffd8),(uint8_t *)in_00,
                               (uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),
                               (uint32_t)((long)in_00 + (ulong)uVar1 >> 0x20));
    local_8 = (long)puVar2 - (long)in_RDI;
  }
  else {
    if ((in_ECX != 1) || (in_R8D != 1)) {
      printf("Unknown delta (%d) type (%d) combination.\n",(ulong)in_ECX,(ulong)in_R8D);
      abort();
    }
    puVar2 = svb_encode_scalar_d1
                       (in_00,(uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),
                        (uint8_t *)((long)in_00 + (ulong)uVar1),in_stack_ffffffffffffffbc);
    local_8 = (long)puVar2 - (long)in_RDI;
  }
  return local_8;
}

Assistant:

size_t svb_encode(uint8_t *out, const uint32_t *in, uint32_t count, int delta,
                    int type) {
  *(uint32_t *)out = count;          // first 4 bytes is number of ints
  uint8_t *keyPtr = out + 4;         // keys come immediately after 32-bit count
  uint32_t keyLen = (count + 3) / 4; // 2-bits rounded to full byte
  uint8_t *dataPtr = keyPtr + keyLen; // variable byte data after all keys

  if (delta == 0 && type == 1) {
    return svb_encode_scalar(in, keyPtr, dataPtr, count) - out;
  }

  if (delta == 1 && type == 1) {
    return svb_encode_scalar_d1(in, keyPtr, dataPtr, count) - out;
  }

  printf("Unknown delta (%d) type (%d) combination.\n", delta, type);
  abort();
}